

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_SPCod_SPCoc
                   (opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_no,OPJ_UINT32 p_comp_no,OPJ_BYTE *p_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 i;
  opj_event_mgr *p_manager_local;
  OPJ_UINT32 *p_header_size_local;
  OPJ_BYTE *p_data_local;
  OPJ_UINT32 p_comp_no_local;
  OPJ_UINT32 p_tile_no_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x25c4,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if (p_header_size == (OPJ_UINT32 *)0x0) {
    __assert_fail("p_header_size != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x25c5,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x25c6,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  if (p_data != (OPJ_BYTE *)0x0) {
    poVar1 = (p_j2k->m_cp).tcps[p_tile_no].tccps + p_comp_no;
    if ((p_j2k->m_cp).tw * (p_j2k->m_cp).th <= p_tile_no) {
      __assert_fail("p_tile_no < (l_cp->tw * l_cp->th)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x25ce,
                    "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                   );
    }
    if (p_comp_no < p_j2k->m_private_image->numcomps) {
      if (*p_header_size < 5) {
        opj_event_msg(p_manager,1,"Error writing SPCod SPCoc element\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        opj_write_bytes_LE(p_data,poVar1->numresolutions - 1,1);
        opj_write_bytes_LE(p_data + 1,poVar1->cblkw - 2,1);
        opj_write_bytes_LE(p_data + 2,poVar1->cblkh - 2,1);
        opj_write_bytes_LE(p_data + 3,poVar1->cblksty,1);
        opj_write_bytes_LE(p_data + 4,poVar1->qmfbid,1);
        p_header_size_local = (OPJ_UINT32 *)(p_data + 5);
        *p_header_size = *p_header_size - 5;
        if ((poVar1->csty & 1) != 0) {
          if (*p_header_size < poVar1->numresolutions) {
            opj_event_msg(p_manager,1,"Error writing SPCod SPCoc element\n");
            return 0;
          }
          for (l_cp._4_4_ = 0; l_cp._4_4_ < poVar1->numresolutions; l_cp._4_4_ = l_cp._4_4_ + 1) {
            opj_write_bytes_LE((OPJ_BYTE *)p_header_size_local,
                               poVar1->prcw[l_cp._4_4_] + poVar1->prch[l_cp._4_4_] * 0x10,1);
            p_header_size_local = (OPJ_UINT32 *)((long)p_header_size_local + 1);
          }
          *p_header_size = *p_header_size - poVar1->numresolutions;
        }
        p_j2k_local._4_4_ = 1;
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_comp_no < (p_j2k->m_private_image->numcomps)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x25cf,
                  "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_data != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x25c7,
                "OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_SPCod_SPCoc(opj_j2k_t *p_j2k,
        OPJ_UINT32 p_tile_no,
        OPJ_UINT32 p_comp_no,
        OPJ_BYTE * p_data,
        OPJ_UINT32 * p_header_size,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_header_size != 00);
    assert(p_manager != 00);
    assert(p_data != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = &l_cp->tcps[p_tile_no];
    l_tccp = &l_tcp->tccps[p_comp_no];

    /* preconditions again */
    assert(p_tile_no < (l_cp->tw * l_cp->th));
    assert(p_comp_no < (p_j2k->m_private_image->numcomps));

    if (*p_header_size < 5) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing SPCod SPCoc element\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, l_tccp->numresolutions - 1, 1); /* SPcoc (D) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblkw - 2, 1);                  /* SPcoc (E) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblkh - 2, 1);                  /* SPcoc (F) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->cblksty,
                    1);                            /* SPcoc (G) */
    ++p_data;

    opj_write_bytes(p_data, l_tccp->qmfbid,
                    1);                             /* SPcoc (H) */
    ++p_data;

    *p_header_size = *p_header_size - 5;

    if (l_tccp->csty & J2K_CCP_CSTY_PRT) {

        if (*p_header_size < l_tccp->numresolutions) {
            opj_event_msg(p_manager, EVT_ERROR, "Error writing SPCod SPCoc element\n");
            return OPJ_FALSE;
        }

        for (i = 0; i < l_tccp->numresolutions; ++i) {
            opj_write_bytes(p_data, l_tccp->prcw[i] + (l_tccp->prch[i] << 4),
                            1);   /* SPcoc (I_i) */
            ++p_data;
        }

        *p_header_size = *p_header_size - l_tccp->numresolutions;
    }

    return OPJ_TRUE;
}